

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha_test.cc
# Opt level: O0

void __thiscall SHATest_SHA1ABI_Test::TestBody(SHATest_SHA1ABI_Test *this)

{
  int iVar1;
  const_iterator piVar2;
  Type_conflict args_2;
  size_t blocks;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 local_90;
  undefined4 local_8c;
  initializer_list<int> local_88;
  initializer_list<int> *local_78;
  initializer_list<int> *__range1;
  SHA_CTX ctx;
  SHATest_SHA1ABI_Test *this_local;
  
  ctx._88_8_ = this;
  SHA1_Init((SHA_CTX *)&__range1);
  __begin1._0_4_ = 1;
  __begin1._4_4_ = 2;
  local_90 = 4;
  local_8c = 8;
  local_88._M_array = (iterator)&__begin1;
  local_88._M_len = 4;
  local_78 = &local_88;
  __end1 = std::initializer_list<int>::begin(local_78);
  piVar2 = std::initializer_list<int>::end(local_78);
  for (; __end1 != piVar2; __end1 = __end1 + 1) {
    args_2 = (Type_conflict)*__end1;
    iVar1 = sha1_hw_capable();
    if (iVar1 != 0) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_hw, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x3a,true,sha1_block_data_order_hw,(Type)&__range1,"",args_2);
    }
    iVar1 = sha1_avx2_capable();
    if (iVar1 != 0) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_avx2, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x3f,true,sha1_block_data_order_avx2,(Type)&__range1,"",args_2);
    }
    iVar1 = sha1_avx_capable();
    if (iVar1 != 0) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_avx, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x44,true,sha1_block_data_order_avx,(Type)&__range1,"",args_2);
    }
    iVar1 = sha1_ssse3_capable();
    if (iVar1 != 0) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_ssse3, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x49,true,sha1_block_data_order_ssse3,(Type)&__range1,"",args_2);
    }
    abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
              ("sha1_block_data_order_nohw, ctx.h, kBuf, blocks",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
               ,0x52,true,sha1_block_data_order_nohw,(Type)&__range1,"",args_2);
  }
  return;
}

Assistant:

TEST(SHATest, SHA1ABI) {
  SHA_CTX ctx;
  SHA1_Init(&ctx);

  static const uint8_t kBuf[SHA_CBLOCK * 8] = {0};
  for (size_t blocks : {1, 2, 4, 8}) {
#if defined(SHA1_ASM)
    CHECK_ABI(sha1_block_data_order, ctx.h, kBuf, blocks);
#endif
#if defined(SHA1_ASM_HW)
    if (sha1_hw_capable()) {
      CHECK_ABI(sha1_block_data_order_hw, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_AVX2)
    if (sha1_avx2_capable()) {
      CHECK_ABI(sha1_block_data_order_avx2, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_AVX)
    if (sha1_avx_capable()) {
      CHECK_ABI(sha1_block_data_order_avx, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_SSSE3)
    if (sha1_ssse3_capable()) {
      CHECK_ABI(sha1_block_data_order_ssse3, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_NEON)
    if (CRYPTO_is_NEON_capable()) {
      CHECK_ABI(sha1_block_data_order_neon, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_NOHW)
    CHECK_ABI(sha1_block_data_order_nohw, ctx.h, kBuf, blocks);
#endif
  }
}